

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O1

kvtree * kvtree_set_kv(kvtree *hash,char *key,char *val)

{
  kvtree_elem *pkVar1;
  kvtree_struct *pkVar2;
  kvtree *pkVar3;
  kvtree_struct *hash_00;
  
  if (hash == (kvtree *)0x0) {
    pkVar2 = (kvtree *)0x0;
  }
  else {
    pkVar1 = kvtree_elem_get(hash,key);
    if (pkVar1 == (kvtree_elem *)0x0) {
      hash_00 = (kvtree_struct *)0x0;
    }
    else {
      hash_00 = pkVar1->hash;
    }
    if (hash_00 == (kvtree_struct *)0x0) {
      pkVar3 = (kvtree *)
               kvtree_malloc(8,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree.c"
                             ,0x47);
      pkVar3->lh_first = (kvtree_elem_struct *)0x0;
      hash_00 = kvtree_set(hash,key,pkVar3);
    }
    pkVar1 = kvtree_elem_get(hash_00,val);
    if (pkVar1 == (kvtree_elem *)0x0) {
      pkVar2 = (kvtree_struct *)0x0;
    }
    else {
      pkVar2 = pkVar1->hash;
    }
    if (pkVar2 == (kvtree_struct *)0x0) {
      pkVar3 = (kvtree *)
               kvtree_malloc(8,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree.c"
                             ,0x47);
      pkVar3->lh_first = (kvtree_elem_struct *)0x0;
      pkVar3 = kvtree_set(hash_00,val,pkVar3);
      return pkVar3;
    }
  }
  return pkVar2;
}

Assistant:

kvtree* kvtree_set_kv(kvtree* hash, const char* key, const char* val)
{
  if (hash == NULL) {
    return NULL;
  }

  kvtree* k = kvtree_get(hash, key);
  if (k == NULL) {
    k = kvtree_set(hash, key, kvtree_new());
  }

  kvtree* v = kvtree_get(k, val);
  if (v == NULL) {
    v = kvtree_set(k, val, kvtree_new());
  }

  return v;
}